

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

uint64 libebml::ReadCodedSizeValue(binary *InBuffer,uint32 *BufferSize,uint64 *SizeUnknown)

{
  byte bVar1;
  uint local_4c;
  byte local_48 [4];
  uint i;
  binary PossibleSize [8];
  uint PossibleSizeLength;
  uint SizeIdx;
  uint64 Result;
  binary SizeBitMask;
  uint64 *SizeUnknown_local;
  uint32 *BufferSize_local;
  binary *InBuffer_local;
  
  PossibleSize[0] = '\0';
  PossibleSize[1] = '\0';
  PossibleSize[2] = '\0';
  PossibleSize[3] = '\0';
  memset(local_48,0,8);
  *SizeUnknown = 0x7f;
  PossibleSize[4] = '\0';
  PossibleSize[5] = '\0';
  PossibleSize[6] = '\0';
  PossibleSize[7] = '\0';
  do {
    if (*BufferSize <= (uint)PossibleSize._4_4_ || 7 < (uint)PossibleSize._4_4_) {
LAB_001b8a3a:
      *BufferSize = 0;
      return 0;
    }
    bVar1 = (byte)PossibleSize._4_4_;
    if (((uint)*InBuffer & 0x80 >> (bVar1 & 0x1f)) != 0) {
      PossibleSize._0_4_ = PossibleSize._4_4_ + 1;
      if (PossibleSize._4_4_ + 1 <= *BufferSize) {
        PossibleSize[4] = '\0';
        PossibleSize[5] = '\0';
        PossibleSize[6] = '\0';
        PossibleSize[7] = '\0';
        for (; (uint)PossibleSize._4_4_ < (uint)PossibleSize._0_4_;
            PossibleSize._4_4_ = PossibleSize._4_4_ + 1) {
          local_48[(uint)PossibleSize._4_4_] = InBuffer[(uint)PossibleSize._4_4_];
        }
        PossibleSize[4] = '\0';
        PossibleSize[5] = '\0';
        PossibleSize[6] = '\0';
        PossibleSize[7] = '\0';
        for (; (uint)PossibleSize._4_4_ < PossibleSize._0_4_ - 1;
            PossibleSize._4_4_ = PossibleSize._4_4_ + 1) {
        }
        _PossibleSizeLength =
             (ulong)(int)((uint)local_48[0] & (0x80 >> (bVar1 & 0x1f) & 0xffU ^ 0xffffffff));
        for (local_4c = 1; local_4c < (uint)PossibleSize._0_4_; local_4c = local_4c + 1) {
          _PossibleSizeLength = (ulong)local_48[local_4c] | _PossibleSizeLength << 8;
        }
        *BufferSize = PossibleSize._0_4_;
        return _PossibleSizeLength;
      }
      goto LAB_001b8a3a;
    }
    *SizeUnknown = *SizeUnknown << 7;
    *SizeUnknown = *SizeUnknown | 0xff;
    PossibleSize._4_4_ = PossibleSize._4_4_ + 1;
  } while( true );
}

Assistant:

uint64 ReadCodedSizeValue(const binary * InBuffer, uint32 & BufferSize, uint64 & SizeUnknown)
{
  binary SizeBitMask = 1 << 7;
  uint64 Result = 0x7F;
  unsigned int SizeIdx, PossibleSizeLength = 0;
  binary PossibleSize[8];
  memset(PossibleSize, 0, 8);

  SizeUnknown = 0x7F; // the last bit is discarded when computing the size
  for (SizeIdx = 0; SizeIdx < BufferSize && SizeIdx < 8; SizeIdx++) {
    if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
      // ID found
      PossibleSizeLength = SizeIdx + 1;
      SizeBitMask >>= SizeIdx;

      // Guard against invalid memory accesses with incomplete IDs.
      if (PossibleSizeLength > BufferSize)
        break;

      for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
        PossibleSize[SizeIdx] = InBuffer[SizeIdx];
      }
      for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
        Result <<= 7;
        Result |= 0xFF;
      }

      Result = 0;
      Result |= PossibleSize[0] & ~SizeBitMask;
      for (unsigned int i = 1; i<PossibleSizeLength; i++) {
        Result <<= 8;
        Result |= PossibleSize[i];
      }

      BufferSize = PossibleSizeLength;

      return Result;
    }
    SizeUnknown <<= 7;
    SizeUnknown |= 0xFF;
  }

  BufferSize = 0;
  return 0;
}